

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorTimer.h
# Opt level: O2

void __thiscall
FactorTimer::initialiseFactorClocks(FactorTimer *this,HighsTimerClock *factor_timer_clock)

{
  HighsTimer *this_00;
  HighsInt HVar1;
  
  this_00 = factor_timer_clock->timer_pointer_;
  std::vector<int,_std::allocator<int>_>::resize(&factor_timer_clock->clock_,0x27);
  HVar1 = HighsTimer::clock_def(this_00,"INVERT");
  *(factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"INVERT Simple");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[1] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"INVERT Kernel");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[2] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"INVERT Deficient");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[3] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"INVERT Finish");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[4] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"FTRAN");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[5] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"FTRAN Lower");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[6] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"FTRAN Lower APF");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[7] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"FTRAN Lower Dse");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[8] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"FTRAN Lower Sps");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[9] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"FTRAN Lower Hyper");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[10] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"FTRAN Upper");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"FTRAN Upper FT");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"FTRAN Upper MPF");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"FTRAN Upper Dse");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"FTRAN Upper Sps0");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"FTRAN Upper Sps1");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x10] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"FTRAN Upper Sps2");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x11] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"FTRAN Upper Hyper0");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x12] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"FTRAN Upper Hyper1");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x13] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"FTRAN Upper Hyper2");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x14] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"FTRAN Upper Hyper3");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x15] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"FTRAN Upper Hyper4");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x16] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"FTRAN Upper Hyper5");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x17] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"FTRAN Upper PF");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x18] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"BTRAN");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x19] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"BTRAN Lower");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x1a] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"BTRAN Lower Dse");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x1b] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"BTRAN Lower Sps");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x1c] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"BTRAN Lower Hyper");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x1d] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"BTRAN Lower APF");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x1e] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"BTRAN Upper");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x1f] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"BTRAN Upper PF");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x20] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"BTRAN Upper Dse");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x21] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"BTRAN Upper Sps");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x22] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"BTRAN Upper Hyper");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x23] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"BTRAN Upper FT");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x24] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"BTRAN Upper MPS");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x25] = HVar1;
  HVar1 = HighsTimer::clock_def(this_00,"ReINVERT");
  (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[0x26] = HVar1;
  return;
}

Assistant:

void initialiseFactorClocks(HighsTimerClock& factor_timer_clock) {
    HighsTimer* timer_pointer = factor_timer_clock.timer_pointer_;
    std::vector<HighsInt>& clock = factor_timer_clock.clock_;
    clock.resize(FactorNumClock);
    clock[FactorInvert] = timer_pointer->clock_def("INVERT");
    clock[FactorInvertSimple] = timer_pointer->clock_def("INVERT Simple");
    clock[FactorInvertKernel] = timer_pointer->clock_def("INVERT Kernel");
    clock[FactorInvertDeficient] = timer_pointer->clock_def("INVERT Deficient");
    clock[FactorInvertFinish] = timer_pointer->clock_def("INVERT Finish");
    clock[FactorFtran] = timer_pointer->clock_def("FTRAN");
    clock[FactorFtranLower] = timer_pointer->clock_def("FTRAN Lower");
    clock[FactorFtranLowerAPF] = timer_pointer->clock_def("FTRAN Lower APF");
    clock[FactorFtranLowerDse] = timer_pointer->clock_def("FTRAN Lower Dse");
    clock[FactorFtranLowerSps] = timer_pointer->clock_def("FTRAN Lower Sps");
    clock[FactorFtranLowerHyper] =
        timer_pointer->clock_def("FTRAN Lower Hyper");
    clock[FactorFtranUpper] = timer_pointer->clock_def("FTRAN Upper");
    clock[FactorFtranUpperFT] = timer_pointer->clock_def("FTRAN Upper FT");
    clock[FactorFtranUpperMPF] = timer_pointer->clock_def("FTRAN Upper MPF");
    clock[FactorFtranUpperDse] = timer_pointer->clock_def("FTRAN Upper Dse");
    clock[FactorFtranUpperSps0] = timer_pointer->clock_def("FTRAN Upper Sps0");
    clock[FactorFtranUpperSps1] = timer_pointer->clock_def("FTRAN Upper Sps1");
    clock[FactorFtranUpperSps2] = timer_pointer->clock_def("FTRAN Upper Sps2");
    clock[FactorFtranUpperHyper0] =
        timer_pointer->clock_def("FTRAN Upper Hyper0");
    clock[FactorFtranUpperHyper1] =
        timer_pointer->clock_def("FTRAN Upper Hyper1");
    clock[FactorFtranUpperHyper2] =
        timer_pointer->clock_def("FTRAN Upper Hyper2");
    clock[FactorFtranUpperHyper3] =
        timer_pointer->clock_def("FTRAN Upper Hyper3");
    clock[FactorFtranUpperHyper4] =
        timer_pointer->clock_def("FTRAN Upper Hyper4");
    clock[FactorFtranUpperHyper5] =
        timer_pointer->clock_def("FTRAN Upper Hyper5");
    clock[FactorFtranUpperPF] = timer_pointer->clock_def("FTRAN Upper PF");
    clock[FactorBtran] = timer_pointer->clock_def("BTRAN");
    clock[FactorBtranLower] = timer_pointer->clock_def("BTRAN Lower");
    clock[FactorBtranLowerDse] = timer_pointer->clock_def("BTRAN Lower Dse");
    clock[FactorBtranLowerSps] = timer_pointer->clock_def("BTRAN Lower Sps");
    clock[FactorBtranLowerHyper] =
        timer_pointer->clock_def("BTRAN Lower Hyper");
    clock[FactorBtranLowerAPF] = timer_pointer->clock_def("BTRAN Lower APF");
    clock[FactorBtranUpper] = timer_pointer->clock_def("BTRAN Upper");
    clock[FactorBtranUpperPF] = timer_pointer->clock_def("BTRAN Upper PF");
    clock[FactorBtranUpperDse] = timer_pointer->clock_def("BTRAN Upper Dse");
    clock[FactorBtranUpperSps] = timer_pointer->clock_def("BTRAN Upper Sps");
    clock[FactorBtranUpperHyper] =
        timer_pointer->clock_def("BTRAN Upper Hyper");
    clock[FactorBtranUpperFT] = timer_pointer->clock_def("BTRAN Upper FT");
    clock[FactorBtranUpperMPF] = timer_pointer->clock_def("BTRAN Upper MPS");
    clock[FactorReinvert] = timer_pointer->clock_def("ReINVERT");
  }